

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls.c
# Opt level: O0

_Bool ECDSA_Sign(COSE *pSigner,int index,eckey_t *eckey,int cbitDigest,byte *rgbToSign,
                size_t cbToSign,cose_errback *perr)

{
  byte bVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  cose_error cVar5;
  mbedtls_md_info_t *md_info;
  _Bool local_241;
  cn_cbor *pcStack_240;
  _Bool result;
  cn_cbor *p;
  mbedtls_mpi s;
  mbedtls_mpi r;
  mbedtls_ctr_drbg_context ctrDrbg;
  mbedtls_entropy_context entropy;
  mbedtls_md_info_t *pmdInfo;
  mbedtls_md_type_t mdType;
  int cbR;
  cn_cbor_errback cbor_error;
  uint8_t *pbSig;
  byte rgbDigest [32];
  size_t cbToSign_local;
  byte *rgbToSign_local;
  int cbitDigest_local;
  eckey_t *eckey_local;
  int index_local;
  COSE *pSigner_local;
  
  cbor_error.pos = 0;
  cbor_error.err = CN_CBOR_NO_ERROR;
  pcStack_240 = (cn_cbor *)0x0;
  local_241 = false;
  rgbDigest._24_8_ = cbToSign;
  mbedtls_entropy_init((mbedtls_entropy_context *)&ctrDrbg.p_entropy);
  mbedtls_ctr_drbg_init((mbedtls_ctr_drbg_context *)&r.s);
  mbedtls_ctr_drbg_seed
            ((mbedtls_ctr_drbg_context *)&r.s,mbedtls_entropy_func,&ctrDrbg.p_entropy,(uchar *)0x0,0
            );
  mbedtls_mpi_init((mbedtls_mpi *)&s.s);
  mbedtls_mpi_init((mbedtls_mpi *)&p);
  if ((eckey->d).n == 0) {
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_PARAMETER;
    }
  }
  else {
    if (cbitDigest == 0x100) {
      pmdInfo._0_4_ = MBEDTLS_MD_SHA256;
    }
    else if (cbitDigest == 0x180) {
      pmdInfo._0_4_ = MBEDTLS_MD_SHA384;
    }
    else {
      if (cbitDigest != 0x200) {
        if (perr != (cose_errback *)0x0) {
          perr->err = COSE_ERR_INVALID_PARAMETER;
        }
        goto LAB_0034dbb9;
      }
      pmdInfo._0_4_ = MBEDTLS_MD_SHA512;
    }
    md_info = mbedtls_md_info_from_type((mbedtls_md_type_t)pmdInfo);
    if (md_info == (mbedtls_md_info_t *)0x0) {
      if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_INVALID_PARAMETER;
      }
    }
    else {
      iVar3 = mbedtls_md(md_info,rgbToSign,rgbDigest._24_8_,(uchar *)&pbSig);
      if (iVar3 == 0) {
        bVar1 = mbedtls_md_get_size(md_info);
        iVar3 = mbedtls_ecdsa_sign_det_ext
                          (&eckey->grp,(mbedtls_mpi *)&s.s,(mbedtls_mpi *)&p,&eckey->d,
                           (uchar *)&pbSig,(ulong)bVar1,(mbedtls_md_type_t)pmdInfo,
                           mbedtls_ctr_drbg_random,&r.s);
        if (iVar3 == 0) {
          iVar3 = (int)((eckey->grp).nbits + 7 >> 3);
          cbor_error = (cn_cbor_errback)calloc((long)iVar3,2);
          if (cbor_error == (cn_cbor_errback)0x0) {
            if (perr != (cose_errback *)0x0) {
              perr->err = COSE_ERR_OUT_OF_MEMORY;
            }
          }
          else {
            iVar4 = mbedtls_mpi_write_binary((mbedtls_mpi *)&s.s,(uchar *)cbor_error,(long)iVar3);
            if (iVar4 == 0) {
              iVar4 = mbedtls_mpi_write_binary
                                ((mbedtls_mpi *)&p,(uchar *)((long)cbor_error + (long)iVar3),
                                 (long)iVar3);
              if (iVar4 == 0) {
                pcStack_240 = cn_cbor_data_create((uint8_t *)cbor_error,iVar3 << 1,
                                                  (cn_cbor_errback *)&mdType);
                if (pcStack_240 == (cn_cbor *)0x0) {
                  if (perr != (cose_errback *)0x0) {
                    cVar5 = _MapFromCBOR(_mdType);
                    perr->err = cVar5;
                  }
                }
                else {
                  _Var2 = _COSE_array_replace(pSigner,pcStack_240,index,(cn_cbor_errback *)0x0);
                  if (_Var2) {
                    pcStack_240 = (cn_cbor *)0x0;
                    cbor_error.pos = 0;
                    cbor_error.err = CN_CBOR_NO_ERROR;
                    local_241 = true;
                  }
                  else if (perr != (cose_errback *)0x0) {
                    perr->err = COSE_ERR_CBOR;
                  }
                }
              }
              else if (perr != (cose_errback *)0x0) {
                perr->err = COSE_ERR_INTERNAL;
              }
            }
            else if (perr != (cose_errback *)0x0) {
              perr->err = COSE_ERR_INTERNAL;
            }
          }
        }
        else if (perr != (cose_errback *)0x0) {
          perr->err = COSE_ERR_CRYPTO_FAIL;
        }
      }
      else if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_INVALID_PARAMETER;
      }
    }
  }
LAB_0034dbb9:
  cn_cbor_free(pcStack_240);
  free((void *)cbor_error);
  mbedtls_mpi_free((mbedtls_mpi *)&s.s);
  mbedtls_mpi_free((mbedtls_mpi *)&p);
  mbedtls_entropy_free((mbedtls_entropy_context *)&ctrDrbg.p_entropy);
  mbedtls_ctr_drbg_free((mbedtls_ctr_drbg_context *)&r.s);
  return local_241;
}

Assistant:

bool ECDSA_Sign(COSE * pSigner, int index, const eckey_t * eckey, int cbitDigest, const byte * rgbToSign, size_t cbToSign, cose_errback * perr)
{
#if defined(MBEDTLS_ECDSA_DETERMINISTIC)
	byte rgbDigest[MBEDTLS_MD_MAX_SIZE];
	uint8_t * pbSig = NULL;
	cn_cbor_errback cbor_error;
	int cbR;
	mbedtls_md_type_t mdType;
	const mbedtls_md_info_t *pmdInfo;
    mbedtls_entropy_context  entropy;
	mbedtls_ctr_drbg_context ctrDrbg;
	mbedtls_mpi r;
	mbedtls_mpi s;
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = &pSigner->m_allocContext;
#endif
	cn_cbor * p = NULL;
	bool result = false;

	mbedtls_entropy_init(&entropy);
    mbedtls_ctr_drbg_init(&ctrDrbg);
    mbedtls_ctr_drbg_seed(&ctrDrbg, mbedtls_entropy_func, &entropy, NULL, 0);
	mbedtls_mpi_init(&r);
	mbedtls_mpi_init(&s);

	CHECK_CONDITION(eckey->d.n != 0, COSE_ERR_INVALID_PARAMETER);

	switch(cbitDigest)
	{
	case 256:
		mdType = MBEDTLS_MD_SHA256;
		break;

	case 384:
		mdType = MBEDTLS_MD_SHA384;
		break;

	case 512:
		mdType = MBEDTLS_MD_SHA512;
		break;

	default:
		FAIL_CONDITION(COSE_ERR_INVALID_PARAMETER);
	}
	pmdInfo = mbedtls_md_info_from_type(mdType);
	CHECK_CONDITION(pmdInfo != NULL, COSE_ERR_INVALID_PARAMETER);
	CHECK_CONDITION(mbedtls_md(pmdInfo, rgbToSign, cbToSign, rgbDigest) == 0, COSE_ERR_INVALID_PARAMETER);

	CHECK_CONDITION(mbedtls_ecdsa_sign_det_ext((mbedtls_ecp_group*)&eckey->grp, &r, &s, &eckey->d, rgbDigest, mbedtls_md_get_size(pmdInfo), mdType, mbedtls_ctr_drbg_random, &ctrDrbg) == 0, COSE_ERR_CRYPTO_FAIL);

	cbR = (eckey->grp.nbits + 7) / 8;

	pbSig = COSE_CALLOC(cbR, 2, context);
	CHECK_CONDITION(pbSig != NULL, COSE_ERR_OUT_OF_MEMORY);

	CHECK_CONDITION(mbedtls_mpi_write_binary(&r, pbSig, cbR) == 0, COSE_ERR_INTERNAL);
	CHECK_CONDITION(mbedtls_mpi_write_binary(&s, pbSig + cbR, cbR) == 0, COSE_ERR_INTERNAL);

	p = cn_cbor_data_create(pbSig, cbR*2, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(p != NULL, cbor_error);

	CHECK_CONDITION(_COSE_array_replace(pSigner, p, index, CBOR_CONTEXT_PARAM_COMMA NULL), COSE_ERR_CBOR);

	p = NULL;
	pbSig = NULL;
	result = true;

errorReturn:
	cn_cbor_free(p CBOR_CONTEXT_PARAM);
	COSE_FREE(pbSig, context);
	mbedtls_mpi_free(&r);
	mbedtls_mpi_free(&s);
    mbedtls_entropy_free(&entropy);
	mbedtls_ctr_drbg_free(&ctrDrbg);
	return result;
#else
	return false;
#endif
}